

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O1

pcp_server_state_e handle_wait_ping_resp_recv(pcp_server_t *s)

{
  pcp_server_state_e pVar1;
  
  pVar1 = handle_wait_io_receive_msg(s);
  if (pVar1 == pss_wait_io) {
    pVar1 = pss_wait_ping_resp;
  }
  else if (pVar1 == pss_wait_io_calc_nearest_timeout) {
    pVar1 = pss_send_all_msgs;
  }
  return pVar1;
}

Assistant:

static pcp_server_state_e handle_wait_ping_resp_recv(pcp_server_t *s) {
    pcp_server_state_e res = handle_wait_io_receive_msg(s);

    switch (res) {
    case pss_wait_io_calc_nearest_timeout:
        res = pss_send_all_msgs;
        break;
    case pss_wait_io:
        res = pss_wait_ping_resp;
        break;
    default:
        break;
    }
    return res;
}